

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inLt(Tokenizer *this,char ch)

{
  if (ch == '<') {
    this->type = tt_dict_open;
    this->state = st_token_ready;
    return;
  }
  this->state = st_in_hexstring;
  inHexstring(this,ch);
  return;
}

Assistant:

void
Tokenizer::inLt(char ch)
{
    if (ch == '<') {
        type = tt::tt_dict_open;
        state = st_token_ready;
        return;
    }

    state = st_in_hexstring;
    inHexstring(ch);
}